

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVector<ImGuiTabBarSortItem> *this;
  ImGuiWindow *pIVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiTabItemFlags IVar8;
  int iVar9;
  int iVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ImGuiID IVar16;
  ImGuiTabItem *pIVar17;
  ImGuiTabItem *pIVar18;
  char *pcVar19;
  ImGuiTabBarSortItem *pIVar20;
  int iVar21;
  int tab_n_2;
  int iVar22;
  int tab_src_n;
  int iVar23;
  int tab_n_1;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImGuiID local_bc;
  float local_b8;
  ImGuiTabItem *local_90;
  ImVec4 local_78;
  undefined8 local_68;
  ImVec2 local_60;
  ImGuiTabItem item_tmp;
  
  pIVar12 = GImGui;
  tab_bar->WantLayout = false;
  iVar21 = 0;
  for (iVar23 = 0; iVar22 = (tab_bar->Tabs).Size, iVar23 < iVar22; iVar23 = iVar23 + 1) {
    pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar23);
    if (pIVar17->LastFrameVisible < tab_bar->PrevFrameVisible) {
      if (pIVar17->ID == tab_bar->SelectedTabId) {
        tab_bar->SelectedTabId = 0;
      }
    }
    else {
      if (iVar23 != iVar21) {
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar23);
        pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
        IVar8 = pIVar17->Flags;
        iVar9 = pIVar17->LastFrameVisible;
        iVar10 = pIVar17->LastFrameSelected;
        iVar22 = pIVar17->NameOffset;
        fVar27 = pIVar17->Offset;
        fVar26 = pIVar17->Width;
        fVar25 = pIVar17->WidthContents;
        pIVar18->ID = pIVar17->ID;
        pIVar18->Flags = IVar8;
        pIVar18->LastFrameVisible = iVar9;
        pIVar18->LastFrameSelected = iVar10;
        pIVar18->NameOffset = iVar22;
        pIVar18->Offset = fVar27;
        pIVar18->Width = fVar26;
        pIVar18->WidthContents = fVar25;
      }
      iVar21 = iVar21 + 1;
    }
  }
  if (iVar22 != iVar21) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,iVar21);
  }
  local_bc = tab_bar->NextSelectedTabId;
  if (local_bc != 0) {
    tab_bar->SelectedTabId = local_bc;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar17 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar17 != (ImGuiTabItem *)0x0) {
      iVar21 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
      iVar21 = iVar21 + tab_bar->ReorderRequestDir;
      if ((-1 < iVar21) && (iVar21 < (tab_bar->Tabs).Size)) {
        pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
        item_tmp.ID = pIVar17->ID;
        item_tmp.Flags = pIVar17->Flags;
        item_tmp.LastFrameVisible = pIVar17->LastFrameVisible;
        item_tmp.LastFrameSelected = pIVar17->LastFrameSelected;
        item_tmp.NameOffset = pIVar17->NameOffset;
        item_tmp.Offset = pIVar17->Offset;
        item_tmp.Width = pIVar17->Width;
        item_tmp.WidthContents = pIVar17->WidthContents;
        IVar16 = pIVar18->ID;
        IVar8 = pIVar18->Flags;
        iVar21 = pIVar18->LastFrameVisible;
        iVar23 = pIVar18->LastFrameSelected;
        fVar27 = pIVar18->Offset;
        fVar26 = pIVar18->Width;
        fVar25 = pIVar18->WidthContents;
        pIVar17->NameOffset = pIVar18->NameOffset;
        pIVar17->Offset = fVar27;
        pIVar17->Width = fVar26;
        pIVar17->WidthContents = fVar25;
        pIVar17->ID = IVar16;
        pIVar17->Flags = IVar8;
        pIVar17->LastFrameVisible = iVar21;
        pIVar17->LastFrameSelected = iVar23;
        pIVar18->ID = item_tmp.ID;
        pIVar18->Flags = item_tmp.Flags;
        pIVar18->LastFrameVisible = item_tmp.LastFrameVisible;
        pIVar18->LastFrameSelected = item_tmp.LastFrameSelected;
        pIVar18->NameOffset = item_tmp.NameOffset;
        pIVar18->Offset = item_tmp.Offset;
        pIVar18->Width = item_tmp.Width;
        pIVar18->WidthContents = item_tmp.WidthContents;
        if (pIVar18->ID == tab_bar->SelectedTabId) {
          local_bc = pIVar18->ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar11 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar1 = GImGui->CurrentWindow;
    fVar27 = (GImGui->Style).FramePadding.y;
    fVar26 = GImGui->FontSize;
    IVar28 = (pIVar1->DC).CursorPos;
    fVar25 = (tab_bar->BarRect).Min.y;
    (pIVar1->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar27;
    (pIVar1->DC).CursorPos.y = fVar25;
    (tab_bar->BarRect).Min.x = fVar26 + fVar27 + (tab_bar->BarRect).Min.x;
    item_tmp.ID = (ImGuiID)(pIVar11->Style).Colors[0].x;
    item_tmp.Flags = (ImGuiTabItemFlags)(pIVar11->Style).Colors[0].y;
    uVar4 = (pIVar11->Style).Colors[0].z;
    uVar5 = (pIVar11->Style).Colors[0].w;
    item_tmp.LastFrameSelected = (int)((float)uVar5 * 0.5);
    item_tmp.LastFrameVisible = uVar4;
    iVar21 = 0;
    PushStyleColor(0,(ImVec4 *)&item_tmp);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar13 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar13) {
      pIVar17 = (ImGuiTabItem *)0x0;
      for (; iVar21 < (tab_bar->Tabs).Size; iVar21 = iVar21 + 1) {
        pIVar18 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
        pcVar19 = ImGuiTabBar::GetTabName(tab_bar,pIVar18);
        local_78.x = 0.0;
        local_78.y = 0.0;
        bVar13 = Selectable(pcVar19,tab_bar->SelectedTabId == pIVar18->ID,0,(ImVec2 *)&local_78);
        if (bVar13) {
          pIVar17 = pIVar18;
        }
      }
      EndPopup();
      (pIVar1->DC).CursorPos = IVar28;
      if (pIVar17 != (ImGuiTabItem *)0x0) {
        local_bc = pIVar17->ID;
        tab_bar->SelectedTabId = local_bc;
      }
    }
    else {
      (pIVar1->DC).CursorPos = IVar28;
    }
  }
  this = &pIVar12->TabSortByWidthBuffer;
  ImVector<ImGuiTabBarSortItem>::resize(this,(tab_bar->Tabs).Size);
  local_b8 = 0.0;
  bVar13 = false;
  local_90 = (ImGuiTabItem *)0x0;
  for (iVar21 = 0; iVar23 = (tab_bar->Tabs).Size, iVar21 < iVar23; iVar21 = iVar21 + 1) {
    pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
    if (pIVar17->LastFrameVisible < tab_bar->PrevFrameVisible) {
      __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                    ,0x18df,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    if ((local_90 == (ImGuiTabItem *)0x0) ||
       (local_90->LastFrameSelected < pIVar17->LastFrameSelected)) {
      local_90 = pIVar17;
    }
    if (pIVar17->ID == tab_bar->SelectedTabId) {
      bVar13 = true;
    }
    pcVar19 = ImGuiTabBar::GetTabName(tab_bar,pIVar17);
    IVar28 = TabItemCalcSize(pcVar19,((uint)pIVar17->Flags >> 0x14 & 1) == 0);
    pIVar17->WidthContents = IVar28.x;
    if (iVar21 == 0) {
      fVar27 = 0.0;
    }
    else {
      fVar27 = (pIVar12->Style).ItemInnerSpacing.x;
    }
    local_b8 = local_b8 + IVar28.x + fVar27;
    pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar21);
    pIVar20->Index = iVar21;
    fVar27 = pIVar17->WidthContents;
    pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar21);
    pIVar20->Width = fVar27;
  }
  fVar27 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar27 = (float)(-(uint)(fVar27 < local_b8) & (uint)(local_b8 - fVar27));
  if ((fVar27 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    fVar27 = GImGui->FontSize * 20.0;
    for (iVar21 = 0; iVar21 < iVar23; iVar21 = iVar21 + 1) {
      pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
      fVar26 = pIVar17->WidthContents;
      if (fVar27 <= pIVar17->WidthContents) {
        fVar26 = fVar27;
      }
      pIVar17->Width = fVar26;
      iVar23 = (tab_bar->Tabs).Size;
    }
  }
  else {
    if (1 < iVar23) {
      qsort((pIVar12->TabSortByWidthBuffer).Data,(long)(pIVar12->TabSortByWidthBuffer).Size,8,
            TabBarSortItemComparer);
    }
    iVar21 = 1;
    while ((0.0 < fVar27 && (iVar23 = (tab_bar->Tabs).Size, iVar21 < iVar23))) {
      for (; iVar21 < iVar23; iVar21 = iVar21 + 1) {
        pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
        fVar26 = pIVar20->Width;
        pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar21);
        iVar23 = (tab_bar->Tabs).Size;
        if ((fVar26 != pIVar20->Width) || (NAN(fVar26) || NAN(pIVar20->Width))) break;
      }
      pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
      fVar26 = pIVar20->Width;
      if (iVar21 < iVar23) {
        pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar21);
        fVar26 = fVar26 - pIVar20->Width;
      }
      else {
        fVar26 = fVar26 + -1.0;
      }
      fVar25 = fVar27 / (float)iVar21;
      if (fVar26 <= fVar25) {
        fVar25 = fVar26;
      }
      iVar22 = 0;
      iVar23 = 0;
      if (0 < iVar21) {
        iVar23 = iVar21;
      }
      for (; iVar23 != iVar22; iVar22 = iVar22 + 1) {
        pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar22);
        pIVar20->Width = pIVar20->Width - fVar25;
      }
      fVar27 = fVar27 - fVar25 * (float)iVar21;
    }
    for (iVar21 = 0; iVar23 = (tab_bar->Tabs).Size, iVar21 < iVar23; iVar21 = iVar21 + 1) {
      pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar21);
      fVar27 = pIVar20->Width;
      pIVar20 = ImVector<ImGuiTabBarSortItem>::operator[](this,iVar21);
      pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar20->Index);
      pIVar17->Width = (float)(int)fVar27;
    }
  }
  fVar27 = 0.0;
  for (iVar21 = 0; iVar21 < iVar23; iVar21 = iVar21 + 1) {
    pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
    pIVar17->Offset = fVar27;
    if ((local_bc == 0) && (local_bc = pIVar17->ID, pIVar12->NavJustMovedToId != local_bc)) {
      local_bc = 0;
    }
    fVar27 = fVar27 + pIVar17->Width + (pIVar12->Style).ItemInnerSpacing.x;
    iVar23 = (tab_bar->Tabs).Size;
  }
  fVar27 = fVar27 - (pIVar12->Style).ItemInnerSpacing.x;
  fVar27 = (float)(-(uint)(0.0 <= fVar27) & (uint)fVar27);
  tab_bar->OffsetMax = fVar27;
  tab_bar->OffsetNextTab = 0.0;
  pIVar11 = GImGui;
  if (1 < iVar23) {
    fVar26 = (tab_bar->BarRect).Min.x;
    fVar25 = (tab_bar->BarRect).Max.x;
    if ((fVar25 - fVar26 < fVar27) && ((tab_bar->Flags & 0x90U) == 0x80)) {
      pIVar1 = GImGui->CurrentWindow;
      fVar31 = GImGui->FontSize + -2.0;
      fVar27 = (GImGui->Style).FramePadding.y;
      IVar28.y = fVar27 + fVar27 + GImGui->FontSize;
      IVar28.x = fVar31;
      fVar32 = fVar31 + fVar31;
      local_60 = (pIVar1->DC).CursorPos;
      fVar27 = (tab_bar->BarRect).Max.y;
      fVar29 = local_60.x;
      fVar30 = local_60.y;
      bVar3 = fVar30 < (tab_bar->BarRect).Min.y;
      bVar2 = fVar25 < fVar32 + fVar29;
      if ((fVar27 < fVar30 || (bVar3 || fVar29 < fVar26)) || bVar2) {
        item_tmp.Flags = (ImGuiTabItemFlags)(fVar27 + 0.0);
        item_tmp.ID = (ImGuiID)((GImGui->Style).ItemInnerSpacing.x + fVar25);
        PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&item_tmp,true);
      }
      item_tmp.ID = (ImGuiID)(pIVar11->Style).Colors[0].x;
      item_tmp.Flags = (ImGuiTabItemFlags)(pIVar11->Style).Colors[0].y;
      uVar6 = (pIVar11->Style).Colors[0].z;
      uVar7 = (pIVar11->Style).Colors[0].w;
      item_tmp.LastFrameSelected = (int)((float)uVar7 * 0.5);
      item_tmp.LastFrameVisible = uVar6;
      PushStyleColor(0,(ImVec4 *)&item_tmp);
      local_78.x = 0.0;
      local_78.y = 0.0;
      local_78.z = 0.0;
      local_78.w = 0.0;
      PushStyleColor(0x15,&local_78);
      local_68._0_4_ = (pIVar11->IO).KeyRepeatDelay;
      local_68._4_4_ = (pIVar11->IO).KeyRepeatRate;
      (pIVar11->IO).KeyRepeatDelay = 0.25;
      (pIVar11->IO).KeyRepeatRate = 0.2;
      fVar25 = (tab_bar->BarRect).Min.y;
      (pIVar1->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar32;
      (pIVar1->DC).CursorPos.y = fVar25;
      bVar14 = ArrowButtonEx("##<",0,IVar28,5);
      fVar25 = (tab_bar->BarRect).Min.y;
      (pIVar1->DC).CursorPos.x = fVar31 + ((tab_bar->BarRect).Max.x - fVar32);
      (pIVar1->DC).CursorPos.y = fVar25;
      bVar15 = ArrowButtonEx("##>",1,IVar28,5);
      iVar21 = -(uint)bVar14;
      if (bVar15) {
        iVar21 = 1;
      }
      PopStyleColor(2);
      (pIVar11->IO).KeyRepeatDelay = (float)(undefined4)local_68;
      (pIVar11->IO).KeyRepeatRate = (float)local_68._4_4_;
      if ((fVar27 < fVar30 || (bVar3 || fVar29 < fVar26)) || bVar2) {
        PopClipRect();
      }
      if ((iVar21 == 0) ||
         (pIVar17 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId),
         pIVar17 == (ImGuiTabItem *)0x0)) {
        pIVar17 = (ImGuiTabItem *)0x0;
      }
      else {
        iVar23 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
        iVar21 = iVar21 + iVar23;
        if ((iVar21 < 0) || ((tab_bar->Tabs).Size <= iVar21)) {
          iVar21 = iVar23;
        }
        pIVar17 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar21);
      }
      (pIVar1->DC).CursorPos = local_60;
      (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar32 + 1.0);
      if (pIVar17 != (ImGuiTabItem *)0x0) {
        local_bc = pIVar17->ID;
        tab_bar->SelectedTabId = local_bc;
      }
    }
  }
  if (bVar13) {
    IVar16 = tab_bar->SelectedTabId;
    if (IVar16 == 0) goto LAB_0013ca16;
  }
  else {
    tab_bar->SelectedTabId = 0;
LAB_0013ca16:
    IVar16 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar16 = 0, local_90 != (ImGuiTabItem *)0x0)) {
      IVar16 = local_90->ID;
      tab_bar->SelectedTabId = IVar16;
      local_bc = IVar16;
    }
  }
  tab_bar->VisibleTabId = IVar16;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_bc != 0) &&
     (pIVar17 = TabBarFindTabByID(tab_bar,local_bc), pIVar17 != (ImGuiTabItem *)0x0)) {
    fVar27 = GImGui->FontSize;
    iVar21 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
    fVar26 = pIVar17->Offset;
    fVar25 = fVar27;
    if (iVar21 < 1) {
      fVar25 = -0.0;
    }
    fVar29 = pIVar17->Width;
    fVar25 = fVar26 - fVar25;
    if ((tab_bar->Tabs).Size <= iVar21 + 1) {
      fVar27 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar27 = fVar26 + fVar29 + fVar27;
    if (tab_bar->ScrollingTarget <= fVar25) {
      fVar29 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
      fVar26 = fVar27 - fVar29;
      if (fVar26 <= tab_bar->ScrollingTarget) goto LAB_0013caff;
      fVar27 = (fVar25 - fVar29) - tab_bar->ScrollingAnim;
    }
    else {
      fVar27 = tab_bar->ScrollingAnim - fVar27;
      fVar26 = fVar25;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar27) & (uint)fVar27);
    tab_bar->ScrollingTarget = fVar26;
  }
LAB_0013caff:
  fVar27 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar27;
  fVar26 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar26;
  if ((fVar27 != fVar26) || (NAN(fVar27) || NAN(fVar26))) {
    fVar25 = pIVar12->FontSize;
    fVar29 = fVar25 * 70.0;
    uVar24 = -(uint)(fVar29 <= tab_bar->ScrollingSpeed);
    fVar30 = ABS(fVar26 - fVar27) / 0.3;
    fVar29 = (float)(~uVar24 & (uint)fVar29 | (uint)tab_bar->ScrollingSpeed & uVar24);
    uVar24 = -(uint)(fVar30 <= fVar29);
    fVar30 = (float)(~uVar24 & (uint)fVar30 | uVar24 & (uint)fVar29);
    tab_bar->ScrollingSpeed = fVar30;
    fVar29 = fVar26;
    if ((pIVar12->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar25 * 10.0)) {
      fVar30 = fVar30 * (pIVar12->IO).DeltaTime;
      if (fVar26 <= fVar27) {
        fVar29 = fVar27;
        if (fVar26 < fVar27) {
          fVar27 = fVar27 - fVar30;
          uVar24 = -(uint)(fVar26 <= fVar27);
          fVar29 = (float)((uint)fVar27 & uVar24 | ~uVar24 & (uint)fVar26);
        }
      }
      else {
        fVar29 = fVar27 + fVar30;
        if (fVar26 <= fVar29) {
          fVar29 = fVar26;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar29;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        tab->WidthContents = TabItemCalcSize(tab_name, (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}